

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestParser.cpp
# Opt level: O3

void __thiscall TestParser_TestOrExpr_Test::TestBody(TestParser_TestOrExpr_Test *this)

{
  long *plVar1;
  long *plVar2;
  long *plVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  AssertionResult gtest_ar;
  Parser parser;
  Message local_e0;
  AssertHelper local_d8;
  Lexer local_d0;
  undefined1 local_a0 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  local_a0._0_8_ = local_a0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"a or b","");
  Lexer::Lexer(&local_d0,(string *)local_a0);
  Parser::Parser((Parser *)(local_a0 + 0x20),&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_d0.m_input._M_dataplus._M_p._1_7_,(char)local_d0.m_input._M_dataplus._M_p)
      != &local_d0.m_input.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_d0.m_input._M_dataplus._M_p._1_7_,
                             (char)local_d0.m_input._M_dataplus._M_p),
                    local_d0.m_input.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  Parser::parse((Parser *)local_a0);
  lVar6 = 0;
  lVar5 = __dynamic_cast(local_a0._0_8_,&AST::Stmt::typeinfo,&AST::ExprStmt::typeinfo,0);
  plVar1 = *(long **)(lVar5 + 8);
  *(undefined8 *)(lVar5 + 8) = 0;
  if (plVar1 != (long *)0x0) {
    lVar6 = __dynamic_cast(plVar1,&AST::Expr::typeinfo,&AST::BinaryExpr::typeinfo,0);
  }
  local_e0.ss_.ptr_._0_4_ = 6;
  testing::internal::CmpHelperEQ<TokenType,TokenType>
            ((internal *)&local_d0,"orExpr->m_op","TokenType::Or",(TokenType *)(lVar6 + 8),
             (TokenType *)&local_e0);
  if ((char)local_d0.m_input._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_e0);
    if ((undefined8 *)local_d0.m_input._M_string_length == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_d0.m_input._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ubclaunchpad[P]durian/test/TestParser.cpp"
               ,0xcc,pcVar7);
    testing::internal::AssertHelper::operator=(&local_d8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    if (CONCAT44(local_e0.ss_.ptr_._4_4_,local_e0.ss_.ptr_._0_4_) != 0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((long *)CONCAT44(local_e0.ss_.ptr_._4_4_,local_e0.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_e0.ss_.ptr_._4_4_,local_e0.ss_.ptr_._0_4_) + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_d0.m_input._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_d0.m_input._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    plVar2 = *(long **)(lVar6 + 0x10);
    *(undefined8 *)(lVar6 + 0x10) = 0;
    if (plVar2 == (long *)0x0) {
      lVar5 = 0;
    }
    else {
      lVar5 = __dynamic_cast(plVar2,&AST::Expr::typeinfo,&AST::Identifier::typeinfo,0);
    }
    plVar3 = *(long **)(lVar6 + 0x18);
    *(undefined8 *)(lVar6 + 0x18) = 0;
    if (plVar3 == (long *)0x0) {
      lVar6 = 0;
    }
    else {
      lVar6 = __dynamic_cast(plVar3,&AST::Expr::typeinfo,&AST::Identifier::typeinfo,0);
    }
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[2]>
              ((internal *)&local_d0,"lident->m_identStr","\"a\"",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar5 + 8),
               (char (*) [2])0x168f99);
    if ((char)local_d0.m_input._M_dataplus._M_p == '\0') {
      testing::Message::Message(&local_e0);
      if ((undefined8 *)local_d0.m_input._M_string_length == (undefined8 *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)local_d0.m_input._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/ubclaunchpad[P]durian/test/TestParser.cpp"
                 ,0xd1,pcVar7);
      testing::internal::AssertHelper::operator=(&local_d8,&local_e0);
      testing::internal::AssertHelper::~AssertHelper(&local_d8);
      if (CONCAT44(local_e0.ss_.ptr_._4_4_,local_e0.ss_.ptr_._0_4_) != 0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           ((long *)CONCAT44(local_e0.ss_.ptr_._4_4_,local_e0.ss_.ptr_._0_4_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_e0.ss_.ptr_._4_4_,local_e0.ss_.ptr_._0_4_) + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_d0.m_input._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_d0.m_input._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      testing::internal::CmpHelperEQ<std::__cxx11::string,char[2]>
                ((internal *)&local_d0,"rident->m_identStr","\"b\"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar6 + 8),
                 (char (*) [2])0x16912a);
      if ((char)local_d0.m_input._M_dataplus._M_p == '\0') {
        testing::Message::Message(&local_e0);
        if ((undefined8 *)local_d0.m_input._M_string_length == (undefined8 *)0x0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = *(char **)local_d0.m_input._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_d8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/ubclaunchpad[P]durian/test/TestParser.cpp"
                   ,0xd2,pcVar7);
        testing::internal::AssertHelper::operator=(&local_d8,&local_e0);
        testing::internal::AssertHelper::~AssertHelper(&local_d8);
        if (CONCAT44(local_e0.ss_.ptr_._4_4_,local_e0.ss_.ptr_._0_4_) != 0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) &&
             ((long *)CONCAT44(local_e0.ss_.ptr_._4_4_,local_e0.ss_.ptr_._0_4_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(local_e0.ss_.ptr_._4_4_,local_e0.ss_.ptr_._0_4_) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_d0.m_input._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    if (plVar3 != (long *)0x0) {
      (**(code **)(*plVar3 + 8))(plVar3);
    }
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))(plVar2);
    }
  }
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))(plVar1);
  }
  if ((long *)local_a0._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_a0._0_8_ + 8))();
  }
  if (local_48 != &local_38) {
    operator_delete(local_48,local_38._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._32_8_ != local_70) {
    operator_delete((void *)local_a0._32_8_,local_70[0]._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(TestParser, TestOrExpr) {
    Parser parser(Lexer("a or b"));
    std::unique_ptr<AST::Stmt> stmt = parser.parse();
    auto* exprStmt = dynamic_cast<AST::ExprStmt*>(stmt.get());
    std::unique_ptr<AST::Expr> expr = std::move(exprStmt->m_expr);
    auto* orExpr = dynamic_cast<AST::BinaryExpr*>(expr.get());
    ASSERT_EQ(orExpr->m_op, TokenType::Or);
    std::unique_ptr<AST::Expr> left = std::move(orExpr->m_left);
    auto* lident = dynamic_cast<AST::Identifier*>(left.get());
    std::unique_ptr<AST::Expr> right = std::move(orExpr->m_right);
    auto* rident = dynamic_cast<AST::Identifier*>(right.get());
    ASSERT_EQ(lident->m_identStr, "a");
    ASSERT_EQ(rident->m_identStr, "b");
}